

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O1

size_t HTS_fread_big_endian(void *buf,size_t size,size_t n,HTS_File *fp)

{
  undefined1 uVar1;
  size_t sVar2;
  undefined1 *puVar3;
  size_t sVar4;
  undefined1 *puVar5;
  ulong uVar6;
  char *q;
  
  sVar2 = HTS_fread(buf,size,n,fp);
  if (sVar2 != 0) {
    puVar3 = (undefined1 *)((long)buf + (size - 1));
    sVar4 = 0;
    do {
      if (1 < size) {
        uVar6 = 0;
        puVar5 = puVar3;
        do {
          uVar1 = *(undefined1 *)((long)buf + uVar6);
          *(undefined1 *)((long)buf + uVar6) = *puVar5;
          *puVar5 = uVar1;
          uVar6 = uVar6 + 1;
          puVar5 = puVar5 + -1;
        } while (size >> 1 != uVar6);
      }
      buf = (void *)((long)buf + size);
      sVar4 = sVar4 + 1;
      puVar3 = puVar3 + size;
    } while (sVar4 != sVar2);
  }
  return sVar2;
}

Assistant:

size_t HTS_fread_big_endian(void *buf, size_t size, size_t n, HTS_File * fp)
{
   size_t block = HTS_fread(buf, size, n, fp);

#ifdef WORDS_LITTLEENDIAN
   HTS_byte_swap(buf, size, block);
#endif                          /* WORDS_LITTLEENDIAN */

   return block;
}